

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoopContinueBreakLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  LayerCase LVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string err;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,0,0);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    Result::~Result(__return_storage_ptr__);
    err.field_2._M_local_buf[0xf] = '\0';
    validateOutputCount(__return_storage_ptr__,layer,0,0);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      err.field_2._M_local_buf[0xf] = '\x01';
    }
    if ((err.field_2._M_local_buf[0xf] & 1U) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (bVar1) {
      if (this->loopStackDepth == 0) {
        std::__cxx11::string::string((string *)local_60);
        LVar2 = Specification::NeuralNetworkLayer::layer_case(layer);
        if (LVar2 == kLoopBreak) {
          psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
          std::__cxx11::string::string((string *)&local_c0,(string *)psVar3);
          std::operator+(&local_a0,"Loop Break Layer \'",&local_c0);
          std::operator+(&local_80,&local_a0,"\' must be inside the bodyNetwork of a loop layer.");
          std::__cxx11::string::operator=((string *)local_60,(string *)&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        else {
          psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
          std::__cxx11::string::string((string *)&local_120,(string *)psVar3);
          std::operator+(&local_100,"Loop Continue Layer \'",&local_120);
          std::operator+(&local_e0,&local_100,"\' must be inside the bodyNetwork of a loop layer.");
          std::__cxx11::string::operator=((string *)local_60,(string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_120);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
        std::__cxx11::string::~string((string *)local_60);
      }
      else {
        Result::Result(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoopContinueBreakLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 0, 0));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 0, 0));

    if (loopStackDepth == 0) {
        std::string err;
        if (layer.layer_case() == Specification::NeuralNetworkLayer::LayerCase::kLoopBreak) {
            err = "Loop Break Layer '" + std::string(layer.name()) + "' must be inside the bodyNetwork of a loop layer.";
        } else {
            err = "Loop Continue Layer '" + std::string(layer.name()) + "' must be inside the bodyNetwork of a loop layer.";
        }
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}